

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<unsigned_short>::clear(QList<unsigned_short> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<unsigned_short> *this_00;
  __off_t __length;
  QArrayDataPointer<unsigned_short> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<unsigned_short> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<unsigned_short> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<unsigned_short> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<unsigned_short>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<unsigned_short>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<unsigned_short> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<unsigned_short>::allocatedCapacity(in_RDI);
      QArrayDataPointer<unsigned_short>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<unsigned_short>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<unsigned_short>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<unsigned_short> *)
                QArrayDataPointer<unsigned_short>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<unsigned_short>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }